

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O2

bool is_binary_string(string *v,string *str)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  bVar6 = false;
  std::__cxx11::string::substr((ulong)&bStack_48,(ulong)v);
  bVar4 = std::operator==(&bStack_48,"b:");
  std::__cxx11::string::~string((string *)&bStack_48);
  if (bVar4) {
    std::__cxx11::string::substr((ulong)&bStack_48,(ulong)v);
    std::__cxx11::string::operator=((string *)str,(string *)&bStack_48);
    std::__cxx11::string::~string((string *)&bStack_48);
    pcVar1 = (str->_M_dataplus)._M_p;
    uVar2 = str->_M_string_length;
    uVar5 = 0;
    while ((uVar3 = uVar2, uVar2 != uVar5 &&
           (bVar4 = qpdf::util::is_hex_digit(pcVar1[uVar5]), uVar3 = uVar5, bVar4))) {
      uVar5 = uVar5 + 1;
    }
    bVar6 = (uVar3 & 1) == 0 && uVar2 == uVar5;
  }
  return bVar6;
}

Assistant:

static bool
is_binary_string(std::string const& v, std::string& str)
{
    if (v.substr(0, 2) == "b:") {
        str = v.substr(2);
        int count = 0;
        for (char c: str) {
            if (!util::is_hex_digit(c)) {
                return false;
            }
            ++count;
        }
        return (count % 2 == 0);
    }
    return false;
}